

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_14x14(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  int aiStack_1f8 [114];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  lVar24 = 0;
  do {
    lVar9 = (long)*(short *)((long)pvVar3 + lVar24 * 2) * (long)coef_block[lVar24] * 0x2000;
    lVar15 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x40) * (long)coef_block[lVar24 + 0x20];
    lVar32 = lVar15 * 0x28c6 + lVar9 + 0x400;
    lVar20 = lVar15 * 0xa12 + lVar9 + 0x400;
    lVar39 = lVar15 * -0x1c37 + lVar9 + 0x400;
    lVar10 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x20) * (long)coef_block[lVar24 + 0x10];
    lVar16 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x60) * (long)coef_block[lVar24 + 0x30];
    lVar8 = (lVar16 + lVar10) * 0x2362;
    lVar21 = lVar10 * 0x8bd + lVar8;
    lVar8 = lVar16 * -0x3704 + lVar8;
    lVar11 = lVar16 * -0x2c1f + lVar10 * 0x13a3;
    lVar10 = lVar21 + lVar32;
    lVar32 = lVar32 - lVar21;
    lVar16 = lVar8 + lVar20;
    lVar20 = lVar20 - lVar8;
    lVar8 = lVar11 + lVar39;
    lVar39 = lVar39 - lVar11;
    lVar11 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x10) * (long)coef_block[lVar24 + 8];
    lVar28 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x30) * (long)coef_block[lVar24 + 0x18];
    lVar22 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x50) * (long)coef_block[lVar24 + 0x28];
    lVar36 = (long)*(short *)((long)pvVar3 + lVar24 * 2 + 0x70) * (long)coef_block[lVar24 + 0x38];
    lVar21 = (lVar28 + lVar11) * 0x2ab7;
    lVar30 = (lVar22 + lVar11) * 0x2652;
    lVar33 = lVar11 * -0x2410 + lVar21 + lVar30 + lVar36 * 0x2000;
    lVar31 = (lVar22 + lVar28) * -0x511 + lVar36 * -0x2000;
    lVar17 = lVar28 * -0xd92 + lVar21 + lVar31;
    lVar31 = lVar22 * -0x4bf7 + lVar30 + lVar31;
    lVar30 = (lVar22 + lVar11) * 0x1814;
    lVar21 = (lVar11 - lVar28) * 0xef2 + lVar36 * -0x2000;
    lVar23 = (lVar22 - lVar28) * 0x2cf8;
    lVar40 = lVar36 * 0x2000 + lVar30 + lVar22 * -0x361a + lVar23;
    lVar30 = lVar11 * -0x21f5 + lVar30 + lVar21;
    lVar21 = lVar28 * 0x1599 + lVar23 + lVar21;
    iVar35 = (int)lVar36 + ((int)(lVar11 - lVar28) - (int)lVar22);
    aiStack_1f8[lVar24] = (int)((ulong)(lVar33 + lVar10) >> 0xb);
    aiStack_1f8[lVar24 + 0x68] = (int)((ulong)(lVar10 - lVar33) >> 0xb);
    aiStack_1f8[lVar24 + 8] = (int)((ulong)(lVar17 + lVar16) >> 0xb);
    aiStack_1f8[lVar24 + 0x60] = (int)((ulong)(lVar16 - lVar17) >> 0xb);
    aiStack_1f8[lVar24 + 0x10] = (int)((ulong)(lVar31 + lVar8) >> 0xb);
    aiStack_1f8[lVar24 + 0x58] = (int)((ulong)(lVar8 - lVar31) >> 0xb);
    iVar1 = (int)(lVar15 * -0x2d42 + lVar9 + 0x400U >> 0xb);
    aiStack_1f8[lVar24 + 0x18] = iVar1 + iVar35 * 4;
    aiStack_1f8[lVar24 + 0x50] = iVar1 + iVar35 * -4;
    aiStack_1f8[lVar24 + 0x20] = (int)((ulong)(lVar40 + lVar39) >> 0xb);
    aiStack_1f8[lVar24 + 0x48] = (int)((ulong)(lVar39 - lVar40) >> 0xb);
    aiStack_1f8[lVar24 + 0x28] = (int)((ulong)(lVar21 + lVar20) >> 0xb);
    aiStack_1f8[lVar24 + 0x40] = (int)((ulong)(lVar20 - lVar21) >> 0xb);
    aiStack_1f8[lVar24 + 0x30] = (int)((ulong)(lVar30 + lVar32) >> 0xb);
    aiStack_1f8[lVar24 + 0x38] = (int)((ulong)(lVar32 - lVar30) >> 0xb);
    lVar24 = lVar24 + 1;
  } while ((int)lVar24 != 8);
  uVar41 = (ulong)output_col;
  lVar24 = 0;
  do {
    iVar38 = aiStack_1f8[lVar24 + 1];
    iVar1 = aiStack_1f8[lVar24 + 4];
    iVar4 = aiStack_1f8[lVar24] * 0x2000;
    iVar25 = iVar4 + iVar1 * 0x28c6 + 0x20000;
    iVar37 = iVar4 + iVar1 * 0xa12 + 0x20000;
    iVar35 = aiStack_1f8[lVar24 + 2];
    iVar29 = iVar1 * -0x1c37 + iVar4 + 0x20000;
    iVar12 = aiStack_1f8[lVar24 + 6];
    iVar18 = (iVar12 + iVar35) * 0x2362;
    iVar5 = iVar4 + iVar1 * -0x2d42 + 0x20000;
    iVar6 = iVar35 * 0x8bd + iVar18;
    iVar18 = iVar12 * -0x3704 + iVar18;
    iVar12 = iVar12 * -0x2c1f + iVar35 * 0x13a3;
    iVar1 = iVar6 + iVar25;
    iVar35 = iVar12 + iVar29;
    iVar29 = iVar29 - iVar12;
    iVar4 = aiStack_1f8[lVar24 + 3];
    iVar25 = iVar25 - iVar6;
    iVar6 = aiStack_1f8[lVar24 + 5];
    iVar12 = iVar18 + iVar37;
    iVar37 = iVar37 - iVar18;
    iVar18 = aiStack_1f8[lVar24 + 7];
    iVar34 = ((iVar38 - iVar4) - iVar6) + iVar18;
    iVar13 = (iVar4 + iVar38) * 0x2ab7;
    iVar26 = (iVar6 + iVar38) * 0x2652;
    iVar7 = iVar38 * -0x2410 + iVar13 + iVar26 + iVar18 * 0x2000;
    iVar14 = (iVar6 + iVar4) * -0x511 + iVar18 * -0x2000;
    iVar19 = iVar4 * -0xd92 + iVar13 + iVar14;
    iVar14 = iVar6 * -0x4bf7 + iVar26 + iVar14;
    iVar26 = (iVar38 - iVar4) * 0xef2 + iVar18 * -0x2000;
    iVar27 = (iVar6 - iVar4) * 0x2cf8;
    iVar13 = (iVar6 + iVar38) * 0x1814;
    iVar6 = iVar6 * -0x361a + iVar18 * 0x2000 + iVar27 + iVar13;
    iVar38 = iVar38 * -0x21f5 + iVar13 + iVar26;
    iVar26 = iVar4 * 0x1599 + iVar27 + iVar26;
    lVar10 = *(long *)((long)output_buf + lVar24);
    *(JSAMPLE *)(lVar10 + uVar41) = pJVar2[(ulong)((uint)(iVar7 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 0xd + uVar41) =
         pJVar2[(ulong)((uint)(iVar1 - iVar7) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 1 + uVar41) =
         pJVar2[(ulong)((uint)(iVar19 + iVar12) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 0xc + uVar41) =
         pJVar2[(ulong)((uint)(iVar12 - iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 2 + uVar41) =
         pJVar2[(ulong)((uint)(iVar14 + iVar35) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 0xb + uVar41) =
         pJVar2[(ulong)((uint)(iVar35 - iVar14) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 3 + uVar41) =
         pJVar2[(ulong)((uint)(iVar34 * 0x2000 + iVar5) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 10 + uVar41) =
         pJVar2[(ulong)((uint)(iVar5 + iVar34 * -0x2000) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 4 + uVar41) =
         pJVar2[(ulong)((uint)(iVar6 + iVar29) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 9 + uVar41) =
         pJVar2[(ulong)((uint)(iVar29 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 5 + uVar41) =
         pJVar2[(ulong)((uint)(iVar26 + iVar37) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 8 + uVar41) =
         pJVar2[(ulong)((uint)(iVar37 - iVar26) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 6 + uVar41) =
         pJVar2[(ulong)((uint)(iVar38 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 7 + uVar41) =
         pJVar2[(ulong)((uint)(iVar25 - iVar38) >> 0x12 & 0x3ff) + 0x80];
    lVar24 = lVar24 + 8;
  } while (lVar24 != 0x70);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_14x14(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 14];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z2 = MULTIPLY(z4, FIX(1.274162392));         /* c4 */
    z3 = MULTIPLY(z4, FIX(0.314692123));         /* c12 */
    z4 = MULTIPLY(z4, FIX(0.881747734));         /* c8 */

    tmp10 = z1 + z2;
    tmp11 = z1 + z3;
    tmp12 = z1 - z4;

    tmp23 = RIGHT_SHIFT(z1 - LEFT_SHIFT(z2 + z3 - z4, 1),
                        CONST_BITS - PASS1_BITS); /* c0 = (c4+c12-c8)*2 */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z3 = MULTIPLY(z1 + z2, FIX(1.105676686));    /* c6 */

    tmp13 = z3 + MULTIPLY(z1, FIX(0.273079590)); /* c2-c6 */
    tmp14 = z3 - MULTIPLY(z2, FIX(1.719280954)); /* c6+c10 */
    tmp15 = MULTIPLY(z1, FIX(0.613604268)) -     /* c10 */
            MULTIPLY(z2, FIX(1.378756276));      /* c2 */

    tmp20 = tmp10 + tmp13;
    tmp26 = tmp10 - tmp13;
    tmp21 = tmp11 + tmp14;
    tmp25 = tmp11 - tmp14;
    tmp22 = tmp12 + tmp15;
    tmp24 = tmp12 - tmp15;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp13 = LEFT_SHIFT(z4, CONST_BITS);

    tmp14 = z1 + z3;
    tmp11 = MULTIPLY(z1 + z2, FIX(1.334852607));           /* c3 */
    tmp12 = MULTIPLY(tmp14, FIX(1.197448846));             /* c5 */
    tmp10 = tmp11 + tmp12 + tmp13 - MULTIPLY(z1, FIX(1.126980169)); /* c3+c5-c1 */
    tmp14 = MULTIPLY(tmp14, FIX(0.752406978));             /* c9 */
    tmp16 = tmp14 - MULTIPLY(z1, FIX(1.061150426));        /* c9+c11-c13 */
    z1    -= z2;
    tmp15 = MULTIPLY(z1, FIX(0.467085129)) - tmp13;        /* c11 */
    tmp16 += tmp15;
    z1    += z4;
    z4    = MULTIPLY(z2 + z3, -FIX(0.158341681)) - tmp13;  /* -c13 */
    tmp11 += z4 - MULTIPLY(z2, FIX(0.424103948));          /* c3-c9-c13 */
    tmp12 += z4 - MULTIPLY(z3, FIX(2.373959773));          /* c3+c5-c13 */
    z4    = MULTIPLY(z3 - z2, FIX(1.405321284));           /* c1 */
    tmp14 += z4 + tmp13 - MULTIPLY(z3, FIX(1.6906431334)); /* c1+c9-c11 */
    tmp15 += z4 + MULTIPLY(z2, FIX(0.674957567));          /* c1+c11-c5 */

    tmp13 = LEFT_SHIFT(z1 - z3, PASS1_BITS);

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)(tmp23 + tmp13);
    wsptr[8 * 10] = (int)(tmp23 - tmp13);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 14 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 14; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z4 = (JLONG)wsptr[4];
    z2 = MULTIPLY(z4, FIX(1.274162392));         /* c4 */
    z3 = MULTIPLY(z4, FIX(0.314692123));         /* c12 */
    z4 = MULTIPLY(z4, FIX(0.881747734));         /* c8 */

    tmp10 = z1 + z2;
    tmp11 = z1 + z3;
    tmp12 = z1 - z4;

    tmp23 = z1 - LEFT_SHIFT(z2 + z3 - z4, 1);    /* c0 = (c4+c12-c8)*2 */

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[6];

    z3 = MULTIPLY(z1 + z2, FIX(1.105676686));    /* c6 */

    tmp13 = z3 + MULTIPLY(z1, FIX(0.273079590)); /* c2-c6 */
    tmp14 = z3 - MULTIPLY(z2, FIX(1.719280954)); /* c6+c10 */
    tmp15 = MULTIPLY(z1, FIX(0.613604268)) -     /* c10 */
            MULTIPLY(z2, FIX(1.378756276));      /* c2 */

    tmp20 = tmp10 + tmp13;
    tmp26 = tmp10 - tmp13;
    tmp21 = tmp11 + tmp14;
    tmp25 = tmp11 - tmp14;
    tmp22 = tmp12 + tmp15;
    tmp24 = tmp12 - tmp15;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];
    z4 = LEFT_SHIFT(z4, CONST_BITS);

    tmp14 = z1 + z3;
    tmp11 = MULTIPLY(z1 + z2, FIX(1.334852607));           /* c3 */
    tmp12 = MULTIPLY(tmp14, FIX(1.197448846));             /* c5 */
    tmp10 = tmp11 + tmp12 + z4 - MULTIPLY(z1, FIX(1.126980169)); /* c3+c5-c1 */
    tmp14 = MULTIPLY(tmp14, FIX(0.752406978));             /* c9 */
    tmp16 = tmp14 - MULTIPLY(z1, FIX(1.061150426));        /* c9+c11-c13 */
    z1    -= z2;
    tmp15 = MULTIPLY(z1, FIX(0.467085129)) - z4;           /* c11 */
    tmp16 += tmp15;
    tmp13 = MULTIPLY(z2 + z3, -FIX(0.158341681)) - z4;     /* -c13 */
    tmp11 += tmp13 - MULTIPLY(z2, FIX(0.424103948));       /* c3-c9-c13 */
    tmp12 += tmp13 - MULTIPLY(z3, FIX(2.373959773));       /* c3+c5-c13 */
    tmp13 = MULTIPLY(z3 - z2, FIX(1.405321284));           /* c1 */
    tmp14 += tmp13 + z4 - MULTIPLY(z3, FIX(1.6906431334)); /* c1+c9-c11 */
    tmp15 += tmp13 + MULTIPLY(z2, FIX(0.674957567));       /* c1+c11-c5 */

    tmp13 = LEFT_SHIFT(z1 - z3, CONST_BITS) + z4;

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}